

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::restart(Amr *this,string *filename)

{
  double dVar1;
  bool bVar2;
  byte bVar3;
  __type _Var4;
  int iVar5;
  ulong uVar6;
  Long LVar7;
  char *pcVar8;
  ostream *poVar9;
  Geometry *pGVar10;
  Box *pBVar11;
  double *pdVar12;
  int *piVar13;
  pointer pAVar14;
  Print *this_00;
  Print *x;
  string *in_RSI;
  long in_RDI;
  Array<int,_3> AVar15;
  double dRestartTime;
  ostringstream ss;
  Box restart_domain;
  int lev_6;
  int lev_5;
  int lev_4;
  int lev_3;
  int i_25;
  int i_24;
  int i_23;
  int i_22;
  int i_21;
  int i_20;
  int i_19;
  int i_18;
  int i_17;
  int i_16;
  int i_15;
  int i_14;
  int i_13;
  int i_12;
  int i_11;
  IntVect intvect_dummy;
  int int_dummy;
  Real real_dummy;
  Geometry geom_dummy;
  int new_finest_level;
  int lev_2;
  int lev_1;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  bool any_changed;
  int i_5;
  Vector<int,_std::allocator<int>_> n_cycle_in;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Box bx;
  int lev;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> inputs_domain;
  int mx_lev;
  string first_line;
  bool new_checkpoint_format;
  int spdim;
  istringstream is;
  string fileCharPtrString;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  IO_Buffer io_buffer;
  string File;
  Vector<char,_std::allocator<char>_> *tempCharArray;
  string faHeaderFullName;
  string faHeaderName;
  istringstream fais;
  string faFileCharPtrString;
  bool bExitOnError;
  Vector<char,_std::allocator<char>_> faHeaderFileChars;
  string faHeaderFilesName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
  faHeaderMap;
  int linit;
  double dRestartTime0;
  pointer in_stack_ffffffffffffed08;
  Print *in_stack_ffffffffffffed10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed18;
  AmrMesh *in_stack_ffffffffffffed20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed38;
  Print *in_stack_ffffffffffffed40;
  key_type *in_stack_ffffffffffffed48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffed50;
  int in_stack_ffffffffffffed80;
  int in_stack_ffffffffffffed84;
  undefined4 in_stack_ffffffffffffede8;
  undefined4 in_stack_ffffffffffffedec;
  istream *in_stack_ffffffffffffedf0;
  Print *in_stack_ffffffffffffeeb0;
  Amr *in_stack_ffffffffffffeef0;
  MPI_Comm *in_stack_ffffffffffffefb8;
  undefined1 in_stack_ffffffffffffefc7;
  Vector<char,_std::allocator<char>_> *in_stack_ffffffffffffefc8;
  string *in_stack_ffffffffffffefd0;
  double local_f18;
  string local_f10 [32];
  ostringstream local_ef0 [376];
  Box local_d78;
  int local_d5c;
  _Type local_d58;
  undefined8 local_d44;
  int local_d3c;
  _Type local_d38;
  undefined8 local_d28;
  int local_d20;
  int local_d18;
  int local_d14;
  int local_d10;
  int local_d0c;
  int local_d08;
  int local_d04;
  int local_d00;
  int local_cfc;
  undefined4 in_stack_fffffffffffff308;
  undefined4 in_stack_fffffffffffff30c;
  undefined4 in_stack_fffffffffffff310;
  undefined4 in_stack_fffffffffffff314;
  int local_ce8;
  int local_ce4;
  int local_ce0;
  int local_cdc;
  int local_cd8;
  int local_cd4;
  IntVect local_cd0;
  int local_cc4;
  double local_cc0 [26];
  int local_bec;
  int local_be8;
  int local_be4;
  int local_be0;
  int local_bdc;
  int local_bd8;
  int local_bd4;
  int local_8bc;
  byte local_8b5;
  int local_8b4;
  int local_898;
  int local_894;
  int local_890;
  int local_88c;
  int local_888;
  undefined8 local_884;
  undefined8 local_87c;
  undefined8 local_874;
  uint local_86c;
  int local_868;
  int local_844;
  string local_840 [35];
  byte local_81d;
  int local_81c;
  istringstream local_818 [391];
  allocator local_691;
  string local_690 [36];
  MPI_Comm local_66c;
  allocator<char> local_649 [25];
  string local_630 [32];
  Long local_610;
  MPI_Comm local_47c;
  Amr *local_478;
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  istringstream local_3f0 [391];
  allocator local_269;
  string local_268 [32];
  MPI_Comm local_248;
  undefined1 local_241;
  string local_228 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
  local_208;
  undefined4 local_1d8;
  double local_40;
  string *local_38;
  char *local_28;
  char *local_20;
  char *local_18;
  undefined8 local_10;
  char *local_8;
  
  *(undefined4 *)(in_RDI + 0x2c0) = 0xffffffff;
  local_38 = in_RSI;
  local_40 = second();
  ParallelDescriptor::Communicator();
  VisMF::SetMFFileInStreams
            ((int)((ulong)in_stack_ffffffffffffed10 >> 0x20),(MPI_Comm)in_stack_ffffffffffffed10);
  if (0 < *(int *)(in_RDI + 8)) {
    OutStream();
    Print::Print(in_stack_ffffffffffffed40,(ostream *)in_stack_ffffffffffffed38);
    Print::operator<<(in_stack_ffffffffffffed10,(char (*) [35])in_stack_ffffffffffffed08);
    Print::operator<<(in_stack_ffffffffffffed10,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffed08);
    Print::operator<<(in_stack_ffffffffffffed10,(char (*) [2])in_stack_ffffffffffffed08);
    Print::~Print((Print *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80));
  }
  if ((*(int *)(in_RDI + 0x2c8) != 0) && (bVar2 = ParallelDescriptor::IOProcessor(), bVar2)) {
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x4d0),"RESTART from file = ");
    poVar9 = std::operator<<(poVar9,local_38);
    std::operator<<(poVar9,'\n');
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    local_1d8 = 0;
    readProbinFile((Amr *)CONCAT44(in_stack_fffffffffffff314,in_stack_fffffffffffff310),
                   (int *)CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308));
  }
  if ((*(int *)(in_RDI + 0x2c8) != 0) && (bVar2 = ParallelDescriptor::IOProcessor(), bVar2)) {
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x4d0),"RESTART from file = ");
    poVar9 = std::operator<<(poVar9,local_38);
    std::operator<<(poVar9,'\n');
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
         *)0x1383583);
  if (((anonymous_namespace)::prereadFAHeaders & 1) != 0) {
    std::operator+(in_stack_ffffffffffffed38,(char *)in_stack_ffffffffffffed30);
    Vector<char,_std::allocator<char>_>::Vector((Vector<char,_std::allocator<char>_> *)0x13835c3);
    local_241 = 0;
    local_248 = ParallelDescriptor::Communicator();
    ParallelDescriptor::ReadAndBcastFile
              (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,(bool)in_stack_ffffffffffffefc7,
               in_stack_ffffffffffffefb8);
    LVar7 = Vector<char,_std::allocator<char>_>::size
                      ((Vector<char,_std::allocator<char>_> *)0x138361c);
    if (0 < LVar7) {
      pcVar8 = Vector<char,_std::allocator<char>_>::dataPtr
                         ((Vector<char,_std::allocator<char>_> *)0x1383633);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,pcVar8,&local_269);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      std::__cxx11::istringstream::istringstream(local_3f0,local_268,_S_in);
      while (bVar3 = std::ios::eof(), ((bVar3 ^ 0xff) & 1) != 0) {
        std::__cxx11::string::string(local_410);
        std::operator>>((istream *)local_3f0,local_410);
        bVar3 = std::ios::eof();
        if ((bVar3 & 1) == 0) {
          std::operator+(in_stack_ffffffffffffed28,(char)((ulong)in_stack_ffffffffffffed20 >> 0x38))
          ;
          std::operator+(in_stack_ffffffffffffed18,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffed10);
          std::operator+(in_stack_ffffffffffffed18,(char *)in_stack_ffffffffffffed10);
          std::__cxx11::string::~string(local_450);
          std::__cxx11::string::~string(local_470);
          in_stack_ffffffffffffeef0 =
               (Amr *)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
                      ::operator[](in_stack_ffffffffffffed50,in_stack_ffffffffffffed48);
          local_478 = in_stack_ffffffffffffeef0;
          local_47c = ParallelDescriptor::Communicator();
          ParallelDescriptor::ReadAndBcastFile
                    (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                     (bool)in_stack_ffffffffffffefc7,in_stack_ffffffffffffefb8);
          if (2 < *(int *)(in_RDI + 8)) {
            OutStream();
            Print::Print(in_stack_ffffffffffffed40,(ostream *)in_stack_ffffffffffffed38);
            Print::operator<<(in_stack_ffffffffffffed10,(char (*) [59])in_stack_ffffffffffffed08);
            Print::operator<<(in_stack_ffffffffffffed10,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffed08);
            Print::operator<<(in_stack_ffffffffffffed10,(char (*) [3])in_stack_ffffffffffffed08);
            Print::operator<<(in_stack_ffffffffffffed10,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffed08);
            Print::operator<<(in_stack_ffffffffffffed10,(char (*) [3])in_stack_ffffffffffffed08);
            local_610 = Vector<char,_std::allocator<char>_>::size
                                  ((Vector<char,_std::allocator<char>_> *)0x13838ec);
            in_stack_ffffffffffffeeb0 =
                 Print::operator<<(in_stack_ffffffffffffed10,(long *)in_stack_ffffffffffffed08);
            Print::operator<<(in_stack_ffffffffffffed10,(char (*) [2])in_stack_ffffffffffffed08);
            Print::~Print((Print *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80));
          }
          std::__cxx11::string::~string(local_430);
        }
        std::__cxx11::string::~string(local_410);
      }
      StateData::SetFAHeaderMapPtr(&local_208);
      std::__cxx11::istringstream::~istringstream(local_3f0);
      std::__cxx11::string::~string(local_268);
    }
    Vector<char,_std::allocator<char>_>::~Vector((Vector<char,_std::allocator<char>_> *)0x1383af0);
    std::__cxx11::string::~string(local_228);
  }
  std::operator+(in_stack_ffffffffffffed38,(char *)in_stack_ffffffffffffed30);
  VisMFBuffer::GetIOBufferSize();
  std::allocator<char>::allocator();
  Vector<char,_std::allocator<char>_>::vector
            ((Vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffed10,
             (size_type)in_stack_ffffffffffffed08,(allocator_type *)0x1383b7d);
  std::allocator<char>::~allocator(local_649);
  Vector<char,_std::allocator<char>_>::Vector((Vector<char,_std::allocator<char>_> *)0x1383ba1);
  local_66c = ParallelDescriptor::Communicator();
  ParallelDescriptor::ReadAndBcastFile
            (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,(bool)in_stack_ffffffffffffefc7,
             in_stack_ffffffffffffefb8);
  pcVar8 = Vector<char,_std::allocator<char>_>::dataPtr
                     ((Vector<char,_std::allocator<char>_> *)0x1383bde);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_690,pcVar8,&local_691);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  std::__cxx11::istringstream::istringstream(local_818,local_690,_S_in);
  local_81d = 0;
  std::__cxx11::string::string(local_840);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_818,local_840);
  _Var4 = std::operator==(in_stack_ffffffffffffed30,in_stack_ffffffffffffed28);
  if (_Var4) {
    local_81d = 1;
    std::istream::operator>>(local_818,&local_81c);
  }
  else {
    pcVar8 = (char *)std::__cxx11::string::c_str();
    local_81c = atoi(pcVar8);
  }
  if (local_81c != 3) {
    poVar9 = ErrorStream();
    poVar9 = std::operator<<(poVar9,"Amr::restart(): bad spacedim = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_81c);
    std::operator<<(poVar9,'\n');
    local_10 = 0;
    Abort_host((char *)in_stack_ffffffffffffed20);
  }
  std::istream::operator>>(local_818,(double *)(in_RDI + 0x140));
  std::istream::operator>>(local_818,&local_844);
  std::istream::operator>>(local_818,(int *)(in_RDI + 0x94));
  std::allocator<amrex::Box>::allocator((allocator<amrex::Box> *)0x1383e8b);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_ffffffffffffed10,
             (size_type)in_stack_ffffffffffffed08,(allocator_type *)0x1383ea8);
  std::allocator<amrex::Box>::~allocator((allocator<amrex::Box> *)0x1383eb7);
  for (local_868 = 0; local_868 <= *(int *)(in_RDI + 0xc); local_868 = local_868 + 1) {
    pGVar10 = AmrMesh::Geom((AmrMesh *)in_stack_ffffffffffffed10,
                            (int)((ulong)in_stack_ffffffffffffed08 >> 0x20));
    pBVar11 = Geometry::Domain(pGVar10);
    Box::smallEnd(pBVar11);
    pGVar10 = AmrMesh::Geom((AmrMesh *)in_stack_ffffffffffffed10,
                            (int)((ulong)in_stack_ffffffffffffed08 >> 0x20));
    pBVar11 = Geometry::Domain(pGVar10);
    Box::bigEnd(pBVar11);
    Box::Box((Box *)in_stack_ffffffffffffed10,(IntVect *)in_stack_ffffffffffffed08,
             (IntVect *)0x1383f42);
    pBVar11 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                        ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                         in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
    *(undefined8 *)(pBVar11->smallend).vect = local_884;
    *(undefined8 *)((pBVar11->smallend).vect + 2) = local_87c;
    *(undefined8 *)((pBVar11->bigend).vect + 1) = local_874;
    (pBVar11->btype).itype = local_86c;
  }
  if (*(int *)(in_RDI + 0xc) < local_844) {
    bVar2 = ParallelDescriptor::IOProcessor();
    if (bVar2) {
      local_8 = "Amr::restart(): max_level is lower than before";
      Warning_host((char *)in_stack_ffffffffffffeeb0);
    }
    piVar13 = std::min<int>((int *)(in_RDI + 0xc),(int *)(in_RDI + 0x94));
    local_bec = *piVar13;
    *(int *)(in_RDI + 0x94) = local_bec;
    Geometry::Geometry((Geometry *)in_stack_ffffffffffffed10);
    IntVect::IntVect(&local_cd0);
    for (local_cd4 = 0; local_cd4 <= *(int *)(in_RDI + 0xc); local_cd4 = local_cd4 + 1) {
      AmrMesh::Geom((AmrMesh *)in_stack_ffffffffffffed10,
                    (int)((ulong)in_stack_ffffffffffffed08 >> 0x20));
      amrex::operator>>(in_stack_ffffffffffffedf0,
                        (Geometry *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
    }
    local_cd8 = *(int *)(in_RDI + 0xc);
    while (local_cd8 = local_cd8 + 1, local_cd8 <= local_844) {
      amrex::operator>>(in_stack_ffffffffffffedf0,
                        (Geometry *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
    }
    for (local_cdc = 0; local_cdc < *(int *)(in_RDI + 0xc); local_cdc = local_cdc + 1) {
      Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                 in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
      amrex::operator>>((istream *)in_stack_ffffffffffffed10,(IntVect *)in_stack_ffffffffffffed08);
    }
    for (local_ce0 = *(int *)(in_RDI + 0xc); local_ce0 < local_844; local_ce0 = local_ce0 + 1) {
      amrex::operator>>((istream *)in_stack_ffffffffffffed10,(IntVect *)in_stack_ffffffffffffed08);
    }
    for (local_ce4 = 0; local_ce4 <= *(int *)(in_RDI + 0xc); local_ce4 = local_ce4 + 1) {
      pdVar12 = Vector<double,_std::allocator<double>_>::operator[]
                          ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      std::istream::operator>>(local_818,pdVar12);
    }
    local_ce8 = *(int *)(in_RDI + 0xc);
    while (local_ce8 = local_ce8 + 1, local_ce8 <= local_844) {
      std::istream::operator>>(local_818,local_cc0);
    }
    if ((local_81d & 1) == 0) {
      for (iVar5 = 0; iVar5 <= *(int *)(in_RDI + 0xc); iVar5 = iVar5 + 1) {
        pdVar12 = Vector<double,_std::allocator<double>_>::operator[]
                            ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        dVar1 = *pdVar12;
        pdVar12 = Vector<double,_std::allocator<double>_>::operator[]
                            ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        *pdVar12 = dVar1;
      }
    }
    else {
      for (iVar5 = 0; iVar5 <= *(int *)(in_RDI + 0xc); iVar5 = iVar5 + 1) {
        pdVar12 = Vector<double,_std::allocator<double>_>::operator[]
                            ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        std::istream::operator>>(local_818,pdVar12);
      }
      iVar5 = *(int *)(in_RDI + 0xc);
      while (iVar5 = iVar5 + 1, iVar5 <= local_844) {
        std::istream::operator>>(local_818,local_cc0);
      }
    }
    for (iVar5 = 0; iVar5 <= *(int *)(in_RDI + 0xc); iVar5 = iVar5 + 1) {
      piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      std::istream::operator>>(local_818,piVar13);
    }
    local_cfc = *(int *)(in_RDI + 0xc);
    while (local_cfc = local_cfc + 1, local_cfc <= local_844) {
      std::istream::operator>>(local_818,&local_cc4);
    }
    for (local_d00 = 0; local_d00 <= *(int *)(in_RDI + 0xc); local_d00 = local_d00 + 1) {
      piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      std::istream::operator>>(local_818,piVar13);
    }
    local_d04 = *(int *)(in_RDI + 0xc);
    while (local_d04 = local_d04 + 1, local_d04 <= local_844) {
      std::istream::operator>>(local_818,&local_cc4);
    }
    for (local_d08 = 0; local_d08 <= *(int *)(in_RDI + 0xc); local_d08 = local_d08 + 1) {
      piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      std::istream::operator>>(local_818,piVar13);
    }
    local_d0c = *(int *)(in_RDI + 0xc);
    while (local_d0c = local_d0c + 1, local_d0c <= local_844) {
      std::istream::operator>>(local_818,&local_cc4);
    }
    if (((anonymous_namespace)::regrid_on_restart != 0) && (0 < *(int *)(in_RDI + 0xc))) {
      piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      if (*piVar13 < 1) {
        local_28 = "restart: can\'t have regrid_on_restart and regrid_int <= 0";
        Error_host((char *)in_stack_ffffffffffffed20);
      }
      else {
        piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        iVar5 = *piVar13;
        piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        *piVar13 = iVar5;
      }
    }
    checkInput(in_stack_ffffffffffffeef0);
    for (local_d10 = 0; local_d10 <= local_bec; local_d10 = local_d10 + 1) {
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
      (**(code **)(**(long **)(in_RDI + 0x968) + 0x28))();
      std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::reset
                ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                 in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
      pAVar14 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                          ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                           0x138529b);
      (*pAVar14->_vptr_AmrLevel[0xb])(pAVar14,in_RDI,local_818,0);
      in_stack_ffffffffffffed80 = local_d10;
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
      pAVar14 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                          ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                           0x13852ea);
      AmrLevel::boxArray(pAVar14);
      AmrMesh::SetBoxArray
                (in_stack_ffffffffffffed20,(int)((ulong)in_stack_ffffffffffffed18 >> 0x20),
                 (BoxArray *)in_stack_ffffffffffffed10);
      in_stack_ffffffffffffed84 = local_d10;
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
      pAVar14 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                          ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                           0x1385335);
      AmrLevel::DistributionMap(pAVar14);
      AmrMesh::SetDistributionMap
                (in_stack_ffffffffffffed20,(int)((ulong)in_stack_ffffffffffffed18 >> 0x20),
                 (DistributionMapping *)in_stack_ffffffffffffed10);
    }
    for (local_d14 = 0; local_d14 <= local_bec; local_d14 = local_d14 + 1) {
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
      pAVar14 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                          ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                           0x13853a6);
      (*pAVar14->_vptr_AmrLevel[0x12])();
    }
  }
  else {
    for (local_888 = 0; local_888 <= local_844; local_888 = local_888 + 1) {
      AmrMesh::Geom((AmrMesh *)in_stack_ffffffffffffed10,
                    (int)((ulong)in_stack_ffffffffffffed08 >> 0x20));
      amrex::operator>>(in_stack_ffffffffffffedf0,
                        (Geometry *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
    }
    for (local_88c = 0; local_88c < local_844; local_88c = local_88c + 1) {
      Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                 in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
      amrex::operator>>((istream *)in_stack_ffffffffffffed10,(IntVect *)in_stack_ffffffffffffed08);
    }
    for (local_890 = 0; local_890 <= local_844; local_890 = local_890 + 1) {
      pdVar12 = Vector<double,_std::allocator<double>_>::operator[]
                          ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      std::istream::operator>>(local_818,pdVar12);
    }
    if ((local_81d & 1) == 0) {
      for (local_898 = 0; local_898 <= local_844; local_898 = local_898 + 1) {
        pdVar12 = Vector<double,_std::allocator<double>_>::operator[]
                            ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        dVar1 = *pdVar12;
        pdVar12 = Vector<double,_std::allocator<double>_>::operator[]
                            ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        *pdVar12 = dVar1;
      }
    }
    else {
      for (local_894 = 0; local_894 <= local_844; local_894 = local_894 + 1) {
        pdVar12 = Vector<double,_std::allocator<double>_>::operator[]
                            ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        std::istream::operator>>(local_818,pdVar12);
      }
    }
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x1384204);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed30,
               (size_type)in_stack_ffffffffffffed28);
    for (local_8b4 = 0; local_8b4 <= local_844; local_8b4 = local_8b4 + 1) {
      piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      std::istream::operator>>(local_818,piVar13);
    }
    local_8b5 = 0;
    for (local_8bc = 0; local_8bc <= local_844; local_8bc = local_8bc + 1) {
      piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      iVar5 = *piVar13;
      piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      if ((iVar5 != *piVar13) && (local_8b5 = 1, 0 < *(int *)(in_RDI + 8))) {
        OutStream();
        Print::Print(in_stack_ffffffffffffed40,(ostream *)in_stack_ffffffffffffed38);
        Print::operator<<(in_stack_ffffffffffffed10,(char (*) [39])in_stack_ffffffffffffed08);
        Print::operator<<(in_stack_ffffffffffffed10,(int *)in_stack_ffffffffffffed08);
        Print::operator<<(in_stack_ffffffffffffed10,(char (*) [7])in_stack_ffffffffffffed08);
        Vector<int,_std::allocator<int>_>::operator[]
                  ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                   (size_type)in_stack_ffffffffffffed08);
        Print::operator<<(in_stack_ffffffffffffed10,(int *)in_stack_ffffffffffffed08);
        Print::operator<<(in_stack_ffffffffffffed10,(char (*) [5])in_stack_ffffffffffffed08);
        Vector<int,_std::allocator<int>_>::operator[]
                  ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                   (size_type)in_stack_ffffffffffffed08);
        Print::operator<<(in_stack_ffffffffffffed10,(int *)in_stack_ffffffffffffed08);
        Print::operator<<(in_stack_ffffffffffffed10,(char (*) [2])in_stack_ffffffffffffed08);
        Print::~Print((Print *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80));
      }
    }
    if ((0 < *(int *)(in_RDI + 0xc)) && ((local_8b5 & 1) != 0)) {
      piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      iVar5 = *piVar13;
      piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      *piVar13 = iVar5;
      if (0 < *(int *)(in_RDI + 8)) {
        OutStream();
        Print::Print(in_stack_ffffffffffffed40,(ostream *)in_stack_ffffffffffffed38);
        Print::operator<<(in_stack_ffffffffffffed10,(char (*) [37])in_stack_ffffffffffffed08);
        Print::~Print((Print *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80));
      }
    }
    for (local_bd4 = 0; local_bd4 <= local_844; local_bd4 = local_bd4 + 1) {
      piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      std::istream::operator>>(local_818,piVar13);
    }
    for (local_bd8 = 0; local_bd8 <= local_844; local_bd8 = local_bd8 + 1) {
      piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      std::istream::operator>>(local_818,piVar13);
    }
    if (local_844 < *(int *)(in_RDI + 0xc)) {
      while (local_bdc = local_844 + 1, local_bdc <= *(int *)(in_RDI + 0xc)) {
        pdVar12 = Vector<double,_std::allocator<double>_>::operator[]
                            ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        dVar1 = *pdVar12;
        piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        iVar5 = *piVar13;
        pdVar12 = Vector<double,_std::allocator<double>_>::operator[]
                            ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        *pdVar12 = dVar1 / (double)iVar5;
        piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        iVar5 = *piVar13;
        piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        iVar5 = iVar5 * *piVar13;
        piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        *piVar13 = iVar5;
        piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        *piVar13 = 0;
        local_844 = local_bdc;
      }
      if (*(int *)(in_RDI + 0x900) == 0) {
        for (local_be0 = 1; local_be0 <= *(int *)(in_RDI + 0x94); local_be0 = local_be0 + 1) {
          pdVar12 = Vector<double,_std::allocator<double>_>::operator[]
                              ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10,
                               (size_type)in_stack_ffffffffffffed08);
          dVar1 = *pdVar12;
          pdVar12 = Vector<double,_std::allocator<double>_>::operator[]
                              ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10,
                               (size_type)in_stack_ffffffffffffed08);
          if ((dVar1 != *pdVar12) || (NAN(dVar1) || NAN(*pdVar12))) {
            local_18 = "restart: must have same dt at all levels if not subcycling";
            Error_host((char *)in_stack_ffffffffffffed20);
          }
        }
      }
    }
    if (((anonymous_namespace)::regrid_on_restart != 0) && (0 < *(int *)(in_RDI + 0xc))) {
      piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                           (size_type)in_stack_ffffffffffffed08);
      if (*piVar13 < 1) {
        local_20 = "restart: can\'t have regrid_on_restart and regrid_int <= 0";
        Error_host((char *)in_stack_ffffffffffffed20);
      }
      else {
        piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        iVar5 = *piVar13;
        piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                             (size_type)in_stack_ffffffffffffed08);
        *piVar13 = iVar5;
      }
    }
    checkInput(in_stack_ffffffffffffeef0);
    for (local_be4 = 0; local_be4 <= *(int *)(in_RDI + 0x94); local_be4 = local_be4 + 1) {
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
      (**(code **)(**(long **)(in_RDI + 0x968) + 0x28))();
      std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::reset
                ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                 in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
      pAVar14 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                          ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                           0x13849dd);
      (*pAVar14->_vptr_AmrLevel[0xb])(pAVar14,in_RDI,local_818,0);
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
      pAVar14 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                          ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                           0x1384a2f);
      AmrLevel::boxArray(pAVar14);
      AmrMesh::SetBoxArray
                (in_stack_ffffffffffffed20,(int)((ulong)in_stack_ffffffffffffed18 >> 0x20),
                 (BoxArray *)in_stack_ffffffffffffed10);
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
      pAVar14 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                          ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                           0x1384a80);
      AmrLevel::DistributionMap(pAVar14);
      AmrMesh::SetDistributionMap
                (in_stack_ffffffffffffed20,(int)((ulong)in_stack_ffffffffffffed18 >> 0x20),
                 (DistributionMapping *)in_stack_ffffffffffffed10);
    }
    for (local_be8 = 0; local_be8 <= *(int *)(in_RDI + 0x94); local_be8 = local_be8 + 1) {
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
      pAVar14 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                          ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                           0x1384afb);
      (*pAVar14->_vptr_AmrLevel[0x12])();
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x1384b2e);
  }
  for (local_d18 = 0; local_d18 <= *(int *)(in_RDI + 0x94); local_d18 = local_d18 + 1) {
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
    std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
              ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)0x1385418);
    pGVar10 = AmrMesh::Geom((AmrMesh *)in_stack_ffffffffffffed10,
                            (int)((ulong)in_stack_ffffffffffffed08 >> 0x20));
    AVar15 = Geometry::isPeriodic(pGVar10);
    local_d38[2] = AVar15._M_elems[2];
    local_d20 = local_d38[2];
    local_d38._0_8_ = AVar15._M_elems._0_8_;
    local_d28._0_4_ = local_d38[0];
    local_d28._4_4_ = local_d38[1];
    local_d38 = AVar15._M_elems;
    AVar15 = Geometry::setPeriodicity
                       ((Geometry *)in_stack_ffffffffffffed20,
                        (Array<int,_3> *)in_stack_ffffffffffffed18);
    local_d58._0_8_ = AVar15._M_elems._0_8_;
    local_d44._0_4_ = local_d58[0];
    local_d44._4_4_ = local_d58[1];
    local_d58[2] = AVar15._M_elems[2];
    local_d3c = local_d58[2];
    local_d58 = AVar15._M_elems;
  }
  piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                      ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                       (size_type)in_stack_ffffffffffffed08);
  *(int *)(in_RDI + 0x208) = *piVar13;
  piVar13 = Vector<int,_std::allocator<int>_>::operator[]
                      ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed10,
                       (size_type)in_stack_ffffffffffffed08);
  *(int *)(in_RDI + 0x238) = *piVar13;
  for (local_d5c = 0; local_d5c <= *(int *)(in_RDI + 0x94); local_d5c = local_d5c + 1) {
    pGVar10 = AmrMesh::Geom((AmrMesh *)in_stack_ffffffffffffed10,
                            (int)((ulong)in_stack_ffffffffffffed08 >> 0x20));
    pBVar11 = Geometry::Domain(pGVar10);
    local_d78.smallend.vect._0_8_ = *(undefined8 *)(pBVar11->smallend).vect;
    local_d78._8_8_ = *(undefined8 *)((pBVar11->smallend).vect + 2);
    local_d78.bigend.vect._4_8_ = *(undefined8 *)((pBVar11->bigend).vect + 1);
    local_d78.btype.itype = (pBVar11->btype).itype;
    pBVar11 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                        ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                         in_stack_ffffffffffffed10,(size_type)in_stack_ffffffffffffed08);
    bVar2 = Box::operator==(pBVar11,&local_d78);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_ef0);
      poVar9 = std::operator<<((ostream *)local_ef0,"Problem at level ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_d5c);
      poVar9 = std::operator<<(poVar9,'\n');
      std::operator<<(poVar9,"Domain according to     inputs file is ");
      Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_ffffffffffffed10,
                 (size_type)in_stack_ffffffffffffed08);
      poVar9 = amrex::operator<<((ostream *)in_stack_ffffffffffffed48,
                                 (Box *)in_stack_ffffffffffffed40);
      in_stack_ffffffffffffed48 = (key_type *)std::operator<<(poVar9,'\n');
      in_stack_ffffffffffffed40 =
           (Print *)std::operator<<((ostream *)in_stack_ffffffffffffed48,
                                    "Domain according to checkpoint file is ");
      in_stack_ffffffffffffed38 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           amrex::operator<<((ostream *)in_stack_ffffffffffffed48,(Box *)in_stack_ffffffffffffed40);
      poVar9 = std::operator<<((ostream *)in_stack_ffffffffffffed38,'\n');
      poVar9 = std::operator<<(poVar9,"Amr::restart() failed -- box from inputs file does not ");
      std::operator<<(poVar9,"equal box from restart file. \n");
      std::__cxx11::ostringstream::str();
      Abort((string *)in_stack_ffffffffffffed08);
      std::__cxx11::string::~string(local_f10);
      std::__cxx11::ostringstream::~ostringstream(local_ef0);
    }
  }
  if (0 < *(int *)(in_RDI + 8)) {
    local_f18 = second();
    local_f18 = local_f18 - local_40;
    iVar5 = ParallelDescriptor::IOProcessorNumber();
    ParallelDescriptor::ReduceRealMax<double>(&local_f18,iVar5);
    OutStream();
    Print::Print(in_stack_ffffffffffffed40,(ostream *)in_stack_ffffffffffffed38);
    Print::operator<<(in_stack_ffffffffffffed10,(char (*) [16])in_stack_ffffffffffffed08);
    this_00 = Print::operator<<(in_stack_ffffffffffffed10,(double *)in_stack_ffffffffffffed08);
    x = Print::operator<<(this_00,(char (*) [10])in_stack_ffffffffffffed08);
    Print::operator<<(this_00,(char *)x);
    Print::~Print((Print *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80));
  }
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::~Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x1385872);
  std::__cxx11::string::~string(local_840);
  std::__cxx11::istringstream::~istringstream(local_818);
  std::__cxx11::string::~string(local_690);
  Vector<char,_std::allocator<char>_>::~Vector((Vector<char,_std::allocator<char>_> *)0x13858a6);
  Vector<char,_std::allocator<char>_>::~Vector((Vector<char,_std::allocator<char>_> *)0x13858b3);
  std::__cxx11::string::~string(local_630);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
          *)0x13858cd);
  return;
}

Assistant:

void
Amr::restart (const std::string& filename)
{
    BL_PROFILE_REGION_START("Amr::restart()");
    BL_PROFILE("Amr::restart()");

    which_level_being_advanced = -1;

    auto dRestartTime0 = amrex::second();

    VisMF::SetMFFileInStreams(mffile_nstreams);

    if (verbose > 0) {
        amrex::Print() << "restarting calculation from file: " << filename << "\n";
    }

    if (record_run_info && ParallelDescriptor::IOProcessor()) {
        runlog << "RESTART from file = " << filename << '\n';
    }
    //
    // Init problem dependent data.
    //

#ifndef AMREX_NO_PROBINIT
    if (!probin_file.empty()) {
        int linit = false;
        readProbinFile(linit);
    }
#endif

    //
    // Start calculation from given restart file.
    //
    if (record_run_info && ParallelDescriptor::IOProcessor()) {
        runlog << "RESTART from file = " << filename << '\n';
    }

    // ---- preread and broadcast all FabArray headers if this file exists
    std::map<std::string, Vector<char> > faHeaderMap;
    if(prereadFAHeaders) {
      // ---- broadcast the file with the names of the fabarray headers
      std::string faHeaderFilesName(filename + "/FabArrayHeaders.txt");
      Vector<char> faHeaderFileChars;
      bool bExitOnError(false);  // ---- dont exit if this file does not exist
      ParallelDescriptor::ReadAndBcastFile(faHeaderFilesName, faHeaderFileChars,
                                           bExitOnError);
      if(faHeaderFileChars.size() > 0) {  // ---- headers were read
        std::string faFileCharPtrString(faHeaderFileChars.dataPtr());
        std::istringstream fais(faFileCharPtrString, std::istringstream::in);
        while ( ! fais.eof()) {  // ---- read and broadcast each header
          std::string faHeaderName;
          fais >> faHeaderName;
          if( ! fais.eof()) {
              std::string faHeaderFullName(filename + '/' + faHeaderName + "_H");
              Vector<char> &tempCharArray = faHeaderMap[faHeaderFullName];
              ParallelDescriptor::ReadAndBcastFile(faHeaderFullName, tempCharArray);
              if(verbose > 2) {
                  amrex::Print()
                      << ":::: faHeaderName faHeaderFullName tempCharArray.size() = " << faHeaderName
                      << "  " << faHeaderFullName << "  " << tempCharArray.size() << "\n";
              }
          }
        }
        StateData::SetFAHeaderMapPtr(&faHeaderMap);
      }
    }

    //
    // Open the checkpoint header file for reading.
    //
    std::string File(filename + "/Header");

    VisMF::IO_Buffer io_buffer(VisMF::GetIOBufferSize());

    Vector<char> fileCharPtr;
    ParallelDescriptor::ReadAndBcastFile(File, fileCharPtr);
    std::string fileCharPtrString(fileCharPtr.dataPtr());
    std::istringstream is(fileCharPtrString, std::istringstream::in);
    //
    // Read global data.
    //
    // Attempt to differentiate between old and new CheckPointFiles.
    //
    int         spdim;
    bool        new_checkpoint_format = false;
    std::string first_line;

    std::getline(is,first_line);

    if (first_line == CheckPointVersion)
    {
        new_checkpoint_format = true;
        is >> spdim;
    }
    else
    {
        spdim = atoi(first_line.c_str());
    }

    if (spdim != AMREX_SPACEDIM)
    {
        amrex::ErrorStream() << "Amr::restart(): bad spacedim = " << spdim << '\n';
        amrex::Abort();
    }

    is >> cumtime;
    int mx_lev;
    is >> mx_lev;
    is >> finest_level;

    Vector<Box> inputs_domain(max_level+1);
    for (int lev = 0; lev <= max_level; ++lev)
    {
        Box bx(Geom(lev).Domain().smallEnd(),Geom(lev).Domain().bigEnd());
        inputs_domain[lev] = bx;
    }

    if (max_level >= mx_lev) {

       for (int i(0); i <= mx_lev; ++i) { is >> Geom(i);      }
       for (int i(0); i <  mx_lev; ++i) { is >> ref_ratio[i]; }
       for (int i(0); i <= mx_lev; ++i) { is >> dt_level[i];  }

       if (new_checkpoint_format)
       {
           for (int i(0); i <= mx_lev; ++i) { is >> dt_min[i]; }
       }
       else
       {
           for (int i(0); i <= mx_lev; ++i) { dt_min[i] = dt_level[i]; }
       }

       Vector<int>  n_cycle_in;
       n_cycle_in.resize(mx_lev+1);
       for (int i(0); i <= mx_lev; ++i) { is >> n_cycle_in[i]; }
       bool any_changed = false;

       for (int i(0); i <= mx_lev; ++i) {
           if (n_cycle[i] != n_cycle_in[i]) {
               any_changed = true;
               if (verbose > 0) {
                   amrex::Print() << "Warning: n_cycle has changed at level " << i <<
                       " from " << n_cycle_in[i] << " to " << n_cycle[i] << "\n";
               }
           }
       }

       // If we change n_cycle then force a full regrid from level 0 up
       if (max_level > 0 && any_changed)
       {
           level_count[0] = regrid_int[0];
           if (verbose > 0) {
               amrex::Print() << "Warning: This forces a full regrid \n";
           }
       }


       for (int i(0); i <= mx_lev; ++i) { is >> level_steps[i]; }
       for (int i(0); i <= mx_lev; ++i) { is >> level_count[i]; }

       //
       // Set bndry conditions.
       //
       if (max_level > mx_lev)
       {
           for (int i(mx_lev + 1); i <= max_level; ++i)
           {
               dt_level[i]    = dt_level[i-1]/n_cycle[i];
               level_steps[i] = n_cycle[i]*level_steps[i-1];
               level_count[i] = 0;
           }

           // This is just an error check
           if ( ! sub_cycle)
           {
               for (int i(1); i <= finest_level; ++i)
               {
                   if (dt_level[i] != dt_level[i-1]) {
                       amrex::Error("restart: must have same dt at all levels if not subcycling");
                   }
               }
           }
       }

       if (regrid_on_restart && max_level > 0)
       {
           if (regrid_int[0] > 0) {
               level_count[0] = regrid_int[0];
           } else {
               amrex::Error("restart: can't have regrid_on_restart and regrid_int <= 0");
           }
       }

       checkInput();
       //
       // Read levels.
       //
       for (int lev(0); lev <= finest_level; ++lev)
       {
           amr_level[lev].reset((*levelbld)());
           amr_level[lev]->restart(*this, is);
           this->SetBoxArray(lev, amr_level[lev]->boxArray());
           this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
       }
       //
       // Build any additional data structures.
       //
       for (int lev = 0; lev <= finest_level; lev++) {
           amr_level[lev]->post_restart();
       }

    } else {

       if (ParallelDescriptor::IOProcessor()) {
          amrex::Warning("Amr::restart(): max_level is lower than before");
       }

       int new_finest_level = std::min(max_level,finest_level);

       finest_level = new_finest_level;

       // These are just used to hold the extra stuff we have to read in.
       Geometry   geom_dummy;
       Real       real_dummy;
       int         int_dummy;
       IntVect intvect_dummy;

       for (int i(0)            ; i <= max_level; ++i) { is >> Geom(i); }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> geom_dummy; }

       for (int i(0)        ; i <  max_level; ++i) { is >> ref_ratio[i]; }
       for (int i(max_level); i <  mx_lev   ; ++i) { is >> intvect_dummy; }

       for (int i(0)            ; i <= max_level; ++i) { is >> dt_level[i]; }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> real_dummy; }

       if (new_checkpoint_format) {
           for (int i(0)            ; i <= max_level; ++i) { is >> dt_min[i]; }
           for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> real_dummy; }
       } else {
           for (int i(0); i <= max_level; ++i) { dt_min[i] = dt_level[i]; }
       }

       for (int i(0)            ; i <= max_level; ++i) { is >> n_cycle[i]; }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> int_dummy; }

       for (int i(0)            ; i <= max_level; ++i) { is >> level_steps[i]; }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> int_dummy; }

       for (int i(0)            ; i <= max_level; ++i) { is >> level_count[i]; }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> int_dummy; }

       if (regrid_on_restart && max_level > 0) {
           if (regrid_int[0] > 0)  {
               level_count[0] = regrid_int[0];
           } else {
               amrex::Error("restart: can't have regrid_on_restart and regrid_int <= 0");
           }
       }

       checkInput();

       //
       // Read levels.
       //
       for (int lev = 0; lev <= new_finest_level; lev++)
       {
           amr_level[lev].reset((*levelbld)());
           amr_level[lev]->restart(*this, is);
           this->SetBoxArray(lev, amr_level[lev]->boxArray());
           this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
       }
       //
       // Build any additional data structures.
       //
       for (int lev = 0; lev <= new_finest_level; lev++) {
           amr_level[lev]->post_restart();
       }
    }

    // Old checkpoints do not store isPeriodic.
    // So we have to set it after restart.
    for (int lev = 0; lev <= finest_level; ++lev)
    {
        amr_level[lev]->geom.setPeriodicity(Geom(lev).isPeriodic());
    }

    // Save the number of steps taken so far. This mainly
    // helps in the edge case where we end up not taking
    // any timesteps before the run terminates, so that
    // we know not to unnecessarily overwrite the old file.
    last_checkpoint = level_steps[0];
    last_plotfile = level_steps[0];

    for (int lev = 0; lev <= finest_level; ++lev)
    {
        Box restart_domain(Geom(lev).Domain());
        if ( ! (inputs_domain[lev] == restart_domain) )
        {
            std::ostringstream ss;
            ss  << "Problem at level " << lev << '\n'
                << "Domain according to     inputs file is " <<  inputs_domain[lev] << '\n'
                << "Domain according to checkpoint file is " << restart_domain      << '\n'
                << "Amr::restart() failed -- box from inputs file does not "
                << "equal box from restart file. \n";
            amrex::Abort(ss.str());
        }
    }

    if (verbose > 0)
    {
        auto dRestartTime = amrex::second() - dRestartTime0;

        ParallelDescriptor::ReduceRealMax(dRestartTime,ParallelDescriptor::IOProcessorNumber());

        amrex::Print() << "Restart time = " << dRestartTime << " seconds." << '\n';
    }
    BL_PROFILE_REGION_STOP("Amr::restart()");
}